

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

void * dlpvalloc(size_t bytes)

{
  void *pvVar1;
  size_t in_RDX;
  size_t extraout_RDX;
  ulong alignment;
  
  if (mparams.magic == 0) {
    init_mparams();
    in_RDX = extraout_RDX;
  }
  alignment = -mparams.page_size & (bytes + mparams.page_size) - 1;
  if (mparams.page_size < 0x11) {
    pvVar1 = malloc(alignment);
    return pvVar1;
  }
  pvVar1 = internal_memalign((mstate)mparams.page_size,alignment,in_RDX);
  return pvVar1;
}

Assistant:

void* dlpvalloc(size_t bytes) {
  size_t pagesz;
  ensure_initialization();
  pagesz = mparams.page_size;
  return dlmemalign(pagesz, (bytes + pagesz - SIZE_T_ONE) & ~(pagesz - SIZE_T_ONE));
}